

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_loader.cpp
# Opt level: O2

bool spvtools::opt::IsLineInst(spv_parsed_instruction_t *inst)

{
  ushort uVar1;
  bool bVar2;
  
  uVar1 = inst->opcode;
  bVar2 = true;
  if ((uVar1 != 8) && (uVar1 != 0x13d)) {
    bVar2 = spvIsExtendedInstruction((uint)uVar1);
    if ((bVar2) && (inst->ext_inst_type == SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100)) {
      bVar2 = inst->words[4] - 0x67 < 2;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool IsLineInst(const spv_parsed_instruction_t* inst) {
  const auto opcode = static_cast<spv::Op>(inst->opcode);
  if (IsOpLineInst(opcode)) return true;
  if (!spvIsExtendedInstruction(opcode)) return false;
  if (inst->ext_inst_type != SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100)
    return false;
  const uint32_t ext_inst_index = inst->words[kExtInstSetIndex];
  const NonSemanticShaderDebugInfo100Instructions ext_inst_key =
      NonSemanticShaderDebugInfo100Instructions(ext_inst_index);
  return ext_inst_key == NonSemanticShaderDebugInfo100DebugLine ||
         ext_inst_key == NonSemanticShaderDebugInfo100DebugNoLine;
}